

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.hpp
# Opt level: O2

string * __thiscall
njoy::ENDFtk::tree::File::content_abi_cxx11_(string *__return_storage_ptr__,File *this)

{
  _Base_ptr p_Var1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  StructureDivision local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->sections_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    local_68.container = __return_storage_ptr__;
    fileEndRecord(&local_60,this->mat_);
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_60,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      for ( const auto& section : this->sections() ) {

        content += section.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        FEND( this->MAT() ).print( output );
      }

      return content;
    }